

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O1

void Interactive(HSQUIRRELVM v)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  void *__src;
  size_t sVar5;
  long lVar6;
  long lVar7;
  SQInteger done;
  SQChar buffer [1024];
  long local_450;
  long local_448;
  undefined8 local_440;
  char local_438 [1032];
  
  local_448 = 0;
  fprintf(_stdout,"%s %s (%d bits)\n","Squirrel 3.1 stable",
          "Copyright (C) 2003-2016 Alberto Demichelis",0x40);
  sq_pushroottable(v);
  sq_pushstring(v,"quit",0xffffffffffffffff);
  sq_pushuserpointer(v,&local_448);
  sq_newclosure(v,quit,1);
  sq_setparamscheck(v,1,0);
  sq_newslot(v,0xfffffffffffffffd,0);
  sq_pop(v,1);
  local_450 = 0;
  bVar2 = false;
  lVar7 = 0;
  do {
    if (local_448 != 0) {
      return;
    }
    printf("\nsq>");
    lVar6 = 0;
    do {
      if (local_448 == 0) {
        iVar3 = getchar();
        if (iVar3 == 0) {
LAB_0010297d:
          if ((lVar6 < 1) || (local_438[lVar6 + -1] != '\\')) {
            iVar3 = 10;
            if (lVar7 == 0) {
              iVar3 = 4;
              bVar1 = false;
              lVar7 = 0;
              goto LAB_001029fa;
            }
          }
          else {
            local_438[lVar6 + -1] = '\n';
            iVar3 = 10;
          }
        }
        else if (iVar3 == 0x7d) {
          lVar7 = lVar7 + -1;
          iVar3 = 0x7d;
        }
        else {
          if (iVar3 == 10) goto LAB_0010297d;
          if ((iVar3 != 0x7b) || (bVar2)) {
            if ((iVar3 == 0x27) || (iVar3 == 0x22)) {
              bVar2 = !bVar2;
            }
            else if (0x3fe < lVar6) {
              Interactive_cold_1();
              iVar3 = 4;
              goto LAB_00102962;
            }
          }
          else {
            lVar7 = lVar7 + 1;
            iVar3 = 0x7b;
            bVar2 = false;
          }
        }
        local_438[lVar6] = (char)iVar3;
        lVar6 = lVar6 + 1;
        iVar3 = 0;
        bVar1 = true;
      }
      else {
        iVar3 = 1;
LAB_00102962:
        bVar1 = false;
      }
LAB_001029fa:
    } while (iVar3 == 0);
    if (iVar3 == 4) {
      local_438[lVar6] = '\0';
      if (local_438[0] == '=') {
        pcVar4 = (char *)sq_getscratchpad(v,0x400);
        snprintf(pcVar4,0x400,"return (%s)",local_438 + 1);
        __src = (void *)sq_getscratchpad(v,0xffffffffffffffff);
        pcVar4 = (char *)sq_getscratchpad(v,0xffffffffffffffff);
        sVar5 = strlen(pcVar4);
        memcpy(local_438,__src,sVar5 + 1);
        local_450 = 1;
      }
      sVar5 = strlen(local_438);
      bVar1 = true;
      if (0 < (long)sVar5) {
        local_440 = sq_gettop(v);
        lVar6 = sq_compilebuffer(v,local_438,sVar5,"interactive console",1);
        if (-1 < lVar6) {
          sq_pushroottable(v);
          lVar6 = sq_call(v,1,local_450,1);
          if (local_450 != 0 && -1 < lVar6) {
            putchar(10);
            sq_pushroottable(v);
            sq_pushstring(v,"print",0xffffffffffffffff);
            sq_get(v,0xfffffffffffffffe);
            sq_pushroottable(v);
            sq_push(v,0xfffffffffffffffc);
            sq_call(v,2,0,1);
            putchar(10);
            local_450 = 0;
          }
        }
        sq_settop(v,local_440);
      }
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void Interactive(HSQUIRRELVM v)
{

#define MAXINPUT 1024
    SQChar buffer[MAXINPUT];
    SQInteger blocks =0;
    SQInteger string=0;
    SQInteger retval=0;
    SQInteger done=0;
    PrintVersionInfos();

    sq_pushroottable(v);
    sq_pushstring(v,_SC("quit"),-1);
    sq_pushuserpointer(v,&done);
    sq_newclosure(v,quit,1);
    sq_setparamscheck(v,1,NULL);
    sq_newslot(v,-3,SQFalse);
    sq_pop(v,1);

    while (!done)
    {
        SQInteger i = 0;
        scprintf(_SC("\nsq>"));
        for(;;) {
            int c;
            if(done)return;
#ifdef _TINSPIRE
            c = nio_getchar();
#else
            c = getchar();
#endif
            if (c == _SC('\n') || c == 0/*nspireio*/) {
                if (i>0 && buffer[i-1] == _SC('\\'))
                {
                    buffer[i-1] = _SC('\n');
                }
                else if(blocks==0)break;
                buffer[i++] = _SC('\n');
            }
            else if (c==_SC('}')) {blocks--; buffer[i++] = (SQChar)c;}
            else if(c==_SC('{') && !string){
                    blocks++;
                    buffer[i++] = (SQChar)c;
            }
            else if(c==_SC('"') || c==_SC('\'')){
                    string=!string;
                    buffer[i++] = (SQChar)c;
            }
            else if (i >= MAXINPUT-1) {
#ifdef _TINSPIRE
                scprintf(_SC("sq : input line too long\n"));
#else
                scfprintf(stderr, _SC("sq : input line too long\n"));
#endif
                break;
            }
            else{
                buffer[i++] = (SQChar)c;
            }
        }
        buffer[i] = _SC('\0');

        if(buffer[0]==_SC('=')){
            scsprintf(sq_getscratchpad(v,MAXINPUT),(size_t)MAXINPUT,_SC("return (%s)"),&buffer[1]);
            memcpy(buffer,sq_getscratchpad(v,-1),(scstrlen(sq_getscratchpad(v,-1))+1)*sizeof(SQChar));
            retval=1;
        }
        i=scstrlen(buffer);
        if(i>0){
            SQInteger oldtop=sq_gettop(v);
            if(SQ_SUCCEEDED(sq_compilebuffer(v,buffer,i,_SC("interactive console"),SQTrue))){
                sq_pushroottable(v);
                if(SQ_SUCCEEDED(sq_call(v,1,retval,SQTrue)) &&  retval){
                    scprintf(_SC("\n"));
                    sq_pushroottable(v);
                    sq_pushstring(v,_SC("print"),-1);
                    sq_get(v,-2);
                    sq_pushroottable(v);
                    sq_push(v,-4);
                    sq_call(v,2,SQFalse,SQTrue);
                    retval=0;
                    scprintf(_SC("\n"));
                }
            }

            sq_settop(v,oldtop);
        }
    }
}